

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O2

ssize_t __thiscall zmq::mailbox_t::recv(mailbox_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  __pid_t _Var1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  void *__buf_00;
  ulong uVar5;
  char *__format;
  char *errmsg_;
  undefined8 uStack_30;
  
  if (this->_active == true) {
    sVar3 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf,__n);
    if ((char)sVar3 == '\0') {
      this->_active = false;
      goto LAB_00158864;
    }
LAB_0015889f:
    uVar5 = 0;
    goto LAB_00158906;
  }
LAB_00158864:
  _Var1 = signaler_t::wait(&this->_signaler,(void *)((ulong)__buf & 0xffffffff));
  if (_Var1 == -1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    uVar5 = 0xffffffffffffffff;
    if ((iVar2 == 4) || (iVar2 == 0xb)) goto LAB_00158906;
    errmsg_ = strerror(iVar2);
    uStack_30 = 0x53;
LAB_001588d9:
    uVar5 = 0xffffffffffffffff;
    __format = "%s (%s:%d)\n";
  }
  else {
    iVar2 = signaler_t::recv_failable(&this->_signaler);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      uVar5 = 0xffffffffffffffff;
      if (*piVar4 == 0xb) goto LAB_00158906;
      errmsg_ = strerror(*piVar4);
      uStack_30 = 0x5a;
      goto LAB_001588d9;
    }
    this->_active = true;
    sVar3 = ypipe_t<zmq::command_t,_16>::read(&this->_cpipe,__fd,__buf_00,__n);
    if ((char)sVar3 != '\0') goto LAB_0015889f;
    __format = "Assertion failed: %s (%s:%d)\n";
    errmsg_ = "ok";
    uVar5 = 0;
    uStack_30 = 99;
  }
  fprintf(_stderr,__format,errmsg_,
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mailbox.cpp"
          ,uStack_30);
  fflush(_stderr);
  zmq_abort(errmsg_);
LAB_00158906:
  return uVar5 & 0xffffffff;
}

Assistant:

int zmq::mailbox_t::recv (command_t *cmd_, int timeout_)
{
    //  Try to get the command straight away.
    if (_active) {
        if (_cpipe.read (cmd_))
            return 0;

        //  If there are no more commands available, switch into passive state.
        _active = false;
    }

    //  Wait for signal from the command sender.
    int rc = _signaler.wait (timeout_);
    if (rc == -1) {
        errno_assert (errno == EAGAIN || errno == EINTR);
        return -1;
    }

    //  Receive the signal.
    rc = _signaler.recv_failable ();
    if (rc == -1) {
        errno_assert (errno == EAGAIN);
        return -1;
    }

    //  Switch into active state.
    _active = true;

    //  Get a command.
    const bool ok = _cpipe.read (cmd_);
    zmq_assert (ok);
    return 0;
}